

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

void __thiscall
QItemSelection::merge(QItemSelection *this,QItemSelection *other,SelectionFlags command)

{
  bool bVar1;
  QItemSelectionRange *pQVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  QItemSelectionRange *this_00;
  qsizetype qVar6;
  long in_FS_OFFSET;
  QItemSelectionRange local_88;
  QArrayDataPointer<QItemSelectionRange> local_78;
  QArrayDataPointer<QItemSelectionRange> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (other->super_QList<QItemSelectionRange>).d.size;
  if (((uint)command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i & 0xe) != 0 && lVar3 != 0) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QItemSelectionRange *)0x0;
    local_58.size = 0;
    QList<QItemSelectionRange>::reserve((QList<QItemSelectionRange> *)&local_58,lVar3);
    local_78.d = (Data *)0x0;
    local_78.ptr = (QItemSelectionRange *)0x0;
    local_78.size = 0;
    lVar3 = (other->super_QList<QItemSelectionRange>).d.size;
    if (lVar3 != 0) {
      this_00 = (other->super_QList<QItemSelectionRange>).d.ptr;
      pQVar2 = this_00 + lVar3;
      do {
        bVar1 = QItemSelectionRange::isValid(this_00);
        if (bVar1) {
          QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange_const&>
                    ((QMovableArrayOps<QItemSelectionRange> *)&local_58,local_58.size,this_00);
          QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_58);
          if ((this->super_QList<QItemSelectionRange>).d.size != 0) {
            lVar3 = 0;
            uVar5 = 0;
            do {
              bVar1 = QItemSelectionRange::intersects
                                (this_00,(QItemSelectionRange *)
                                         ((long)&(((this->super_QList<QItemSelectionRange>).d.ptr)->
                                                 tl).d + lVar3));
              if (bVar1) {
                QItemSelectionRange::intersected
                          (&local_88,
                           (QItemSelectionRange *)
                           ((long)&(((this->super_QList<QItemSelectionRange>).d.ptr)->tl).d + lVar3)
                          );
                QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                          ((QMovableArrayOps<QItemSelectionRange> *)&local_78,local_78.size,
                           &local_88);
                QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_78);
                QPersistentModelIndex::~QPersistentModelIndex(&local_88.br);
                QPersistentModelIndex::~QPersistentModelIndex(&local_88.tl);
              }
              uVar5 = uVar5 + 1;
              lVar3 = lVar3 + 0x10;
            } while (uVar5 < (ulong)(this->super_QList<QItemSelectionRange>).d.size);
          }
        }
        this_00 = this_00 + 1;
      } while (this_00 != pQVar2);
      if (local_78.size != 0) {
        uVar5 = 0;
        do {
          if ((this->super_QList<QItemSelectionRange>).d.size != 0) {
            qVar6 = 0;
            iVar4 = 0;
            do {
              bVar1 = QItemSelectionRange::intersects
                                ((this->super_QList<QItemSelectionRange>).d.ptr + qVar6,
                                 local_78.ptr + uVar5);
              if (bVar1) {
                split((this->super_QList<QItemSelectionRange>).d.ptr + qVar6,local_78.ptr + uVar5,
                      this);
                QList<QItemSelectionRange>::removeAt(&this->super_QList<QItemSelectionRange>,qVar6);
              }
              else {
                iVar4 = iVar4 + 1;
              }
              qVar6 = (qsizetype)iVar4;
            } while (qVar6 < (this->super_QList<QItemSelectionRange>).d.size);
          }
          if ((((uint)command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                      super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i & 8) != 0) &&
             (local_58.size != 0)) {
            qVar6 = 0;
            iVar4 = 0;
            do {
              bVar1 = QItemSelectionRange::intersects(local_58.ptr + qVar6,local_78.ptr + uVar5);
              if (bVar1) {
                split(local_58.ptr + qVar6,local_78.ptr + uVar5,(QItemSelection *)&local_58);
                QList<QItemSelectionRange>::removeAt((QList<QItemSelectionRange> *)&local_58,qVar6);
              }
              else {
                iVar4 = iVar4 + 1;
              }
              qVar6 = (qsizetype)iVar4;
            } while (qVar6 < local_58.size);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)local_78.size);
      }
    }
    if (((uint)command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
               super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i & 4) == 0) {
      QtPrivate::QCommonArrayOps<QItemSelectionRange>::growAppend
                ((QCommonArrayOps<QItemSelectionRange> *)this,local_58.ptr,
                 local_58.ptr + local_58.size);
    }
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemSelection::merge(const QItemSelection &other, QItemSelectionModel::SelectionFlags command)
{
    if (other.isEmpty() ||
          !(command & QItemSelectionModel::Select ||
          command & QItemSelectionModel::Deselect ||
          command & QItemSelectionModel::Toggle))
        return;

    QItemSelection newSelection;
    newSelection.reserve(other.size());
    // Collect intersections
    QItemSelection intersections;
    for (const auto &range : other) {
        if (!range.isValid())
            continue;
        newSelection.push_back(range);
        for (int t = 0; t < size(); ++t) {
            if (range.intersects(at(t)))
                intersections.append(at(t).intersected(range));
        }
    }

    //  Split the old (and new) ranges using the intersections
    for (int i = 0; i < intersections.size(); ++i) { // for each intersection
        for (int t = 0; t < size();) { // splitt each old range
            if (at(t).intersects(intersections.at(i))) {
                split(at(t), intersections.at(i), this);
                removeAt(t);
            } else {
                ++t;
            }
        }
        // only split newSelection if Toggle is specified
        for (int n = 0; (command & QItemSelectionModel::Toggle) && n < newSelection.size();) {
            if (newSelection.at(n).intersects(intersections.at(i))) {
                split(newSelection.at(n), intersections.at(i), &newSelection);
                newSelection.removeAt(n);
            } else {
                ++n;
            }
        }
    }
    // do not add newSelection for Deselect
    if (!(command & QItemSelectionModel::Deselect))
        operator+=(newSelection);
}